

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Pubkey::GetFingerprint(ByteData *__return_storage_ptr__,Pubkey *this,uint32_t get_size)

{
  bool bVar1;
  CfdException *this_00;
  uint32_t get_size_local;
  ByteData data;
  ByteData160 data160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  
  get_size_local = get_size;
  if (0xffffffeb < get_size - 0x15) {
    ByteData::ByteData(&data);
    bVar1 = IsCompress(this);
    if (bVar1) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&data.data_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    }
    else {
      Compress((Pubkey *)&data160,this);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&data.data_,(_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data160
                );
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data160);
    }
    HashUtil::Hash160(&data160,&data);
    ByteData160::GetBytes(&bytes,&data160);
    ByteData::ByteData(__return_storage_ptr__,
                       bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,get_size);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data160);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    return __return_storage_ptr__;
  }
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcore_key.cpp";
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x51;
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "GetFingerprint";
  logger::warn<unsigned_int&>
            ((CfdSourceLocation *)&data,"Invalid fingerprint size: {}.",&get_size_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&data,"Invalid fingerprint size.",(allocator *)&data160);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&data);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Pubkey::GetFingerprint(uint32_t get_size) const {
  if ((get_size == 0) || (get_size > kByteData160Length)) {
    warn(CFD_LOG_SOURCE, "Invalid fingerprint size: {}.", get_size);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid fingerprint size.");
  }

  ByteData data;
  if (IsCompress()) {
    data = data_;
  } else {
    data = Compress().data_;
  }
  auto data160 = HashUtil::Hash160(data);
  auto bytes = data160.GetBytes();
  return ByteData(bytes.data(), get_size);
}